

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void __thiscall HTTPRequestTracker::AddRequest(HTTPRequestTracker *this,evhttp_request *req)

{
  evhttp_request **ppeVar1;
  evhttp_connection **ppeVar2;
  long in_FS_OFFSET;
  evhttp_connection *conn;
  anon_class_16_2_3fde98e7 local_48;
  evhttp_connection *local_38;
  evhttp_request *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = req;
  ppeVar1 = inline_assertion_check<true,evhttp_request*&>
                      (&local_30,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                       ,0xae,"AddRequest","req");
  local_48.this = (HTTPRequestTracker *)evhttp_request_get_connection(*ppeVar1);
  ppeVar2 = inline_assertion_check<true,evhttp_connection*>
                      ((evhttp_connection **)&local_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                       ,0xae,"AddRequest","evhttp_request_get_connection(Assert(req))");
  local_38 = *ppeVar2;
  local_48.conn = &local_38;
  local_48.this = this;
  AddRequest::anon_class_16_2_3fde98e7::operator()(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        const evhttp_connection* conn{Assert(evhttp_request_get_connection(Assert(req)))};
        WITH_LOCK(m_mutex, ++m_tracker[conn]);
    }